

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void qtree_expand(uchar *infile,uchar *a,int nx,int ny,uchar *b)

{
  int iVar1;
  int local_2c;
  int i;
  uchar *b_local;
  int ny_local;
  int nx_local;
  uchar *a_local;
  uchar *infile_local;
  
  qtree_copy(a,nx,ny,b,ny);
  local_2c = nx * ny;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    if (b[local_2c] != '\0') {
      iVar1 = input_huffman(infile);
      b[local_2c] = (uchar)iVar1;
    }
  }
  return;
}

Assistant:

static void
qtree_expand(unsigned char *infile, unsigned char a[], int nx, int ny, unsigned char b[])
{
int i;

	/*
	 * first copy a to b, expanding each 4-bit value
	 */
	qtree_copy(a,nx,ny,b,ny);
	/*
	 * now read new 4-bit values into b for each non-zero element
	 */
	for (i = nx*ny-1; i >= 0; i--) {
		if (b[i]) b[i] = input_huffman(infile);
	}
}